

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int head_version(char *irafheader)

{
  int iVar1;
  char *irafheader_local;
  
  iVar1 = irafncmp(irafheader,"imhdr",5);
  if (iVar1 == 0) {
    irafheader_local._4_4_ = 1;
  }
  else {
    iVar1 = strncmp(irafheader,"imhv2",5);
    if (iVar1 == 0) {
      irafheader_local._4_4_ = 2;
    }
    else {
      irafheader_local._4_4_ = 0;
    }
  }
  return irafheader_local._4_4_;
}

Assistant:

static int head_version (
    char *irafheader)	/* IRAF image header from file */

{

    /* Check header file magic word */
    if (irafncmp (irafheader, "imhdr", 5) != 0 ) {
	if (strncmp (irafheader, "imhv2", 5) != 0)
	    return (0);
	else
	    return (2);
	}
    else
	return (1);
}